

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soplexmain.cpp
# Opt level: O2

void checkSolution<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
               (SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                *soplex)

{
  int iVar1;
  ostream *poVar2;
  bool bVar3;
  type_conflict5 tVar4;
  SPxOut *pSVar5;
  long lVar6;
  Verbosity old_verbosity;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar7;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar8;
  char *pcVar9;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar10;
  data_type *pdVar11;
  Rational *pRVar12;
  Verbosity old_verbosity_4;
  Verbosity VVar13;
  byte bVar14;
  uint uVar15;
  Verbosity old_verbosity_1;
  Rational rowviol;
  bool abStack_2c4 [12];
  Rational maxviol;
  Rational sumviol;
  Rational boundviol;
  data_type local_138 [7];
  int local_c8;
  undefined1 local_c4;
  ulong local_c0;
  data_type local_b8 [7];
  int local_48;
  undefined1 local_44;
  ulong local_40;
  
  bVar14 = 0;
  iVar1 = soplex->_currentSettings->_intParamValues[0x12];
  if ((iVar1 == 2) || ((iVar1 == 1 && (soplex->_currentSettings->_intParamValues[0x10] == 1)))) {
    if ((soplex->_hasSolReal == false) && ((soplex->_hasSolRational & 1U) == 0)) {
      VVar13 = (soplex->spxout).m_verbosity;
      if (2 < (int)VVar13) {
        (soplex->spxout).m_verbosity = INFO1;
        ::soplex::operator<<(&soplex->spxout,"No primal solution available.\n");
        (soplex->spxout).m_verbosity = VVar13;
      }
    }
    else {
      boundviol.m_backend.m_value.num.m_backend.
      super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
      .m_data.la[0] = 0;
      boundviol.m_backend.m_value.num.m_backend.
      super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
      .m_limbs = 1;
      boundviol.m_backend.m_value.num.m_backend.
      super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
      .m_sign = false;
      boundviol.m_backend.m_value.num.m_backend.
      super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
      .m_internal = true;
      boundviol.m_backend.m_value.num.m_backend.
      super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
      .m_alias = false;
      boundviol.m_backend.m_value.den.m_backend.
      super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
      .m_data.la[0] = 1;
      rowviol.m_backend.m_value.num.m_backend.
      super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
      .m_data.la[0] = 0;
      boundviol.m_backend.m_value.den.m_backend.
      super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
      .m_limbs = 1;
      boundviol.m_backend.m_value.den.m_backend.
      super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
      .m_sign = false;
      boundviol.m_backend.m_value.den.m_backend.
      super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
      .m_internal = true;
      boundviol.m_backend.m_value.den.m_backend.
      super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
      .m_alias = false;
      rowviol.m_backend.m_value.num.m_backend.
      super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
      .m_limbs = 1;
      rowviol.m_backend.m_value.num.m_backend.
      super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
      .m_sign = false;
      rowviol.m_backend.m_value.num.m_backend.
      super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
      .m_internal = true;
      rowviol.m_backend.m_value.num.m_backend.
      super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
      .m_alias = false;
      rowviol.m_backend.m_value.den.m_backend.
      super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
      .m_data.la[0] = 1;
      sumviol.m_backend.m_value.num.m_backend.
      super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
      .m_data.la[0] = 0;
      rowviol.m_backend.m_value.den.m_backend.
      super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
      .m_limbs = 1;
      rowviol.m_backend.m_value.den.m_backend.
      super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
      .m_sign = false;
      rowviol.m_backend.m_value.den.m_backend.
      super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
      .m_internal = true;
      rowviol.m_backend.m_value.den.m_backend.
      super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
      .m_alias = false;
      sumviol.m_backend.m_value.num.m_backend.
      super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
      .m_limbs = 1;
      sumviol.m_backend.m_value.num.m_backend.
      super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
      .m_sign = false;
      sumviol.m_backend.m_value.num.m_backend.
      super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
      .m_internal = true;
      sumviol.m_backend.m_value.num.m_backend.
      super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
      .m_alias = false;
      sumviol.m_backend.m_value.den.m_backend.
      super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
      .m_data.la[0] = 1;
      sumviol.m_backend.m_value.den.m_backend.
      super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
      .m_limbs = 1;
      sumviol.m_backend.m_value.den.m_backend.
      super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
      .m_sign = false;
      sumviol.m_backend.m_value.den.m_backend.
      super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
      .m_internal = true;
      sumviol.m_backend.m_value.den.m_backend.
      super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
      .m_alias = false;
      bVar3 = ::soplex::
              SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ::getBoundViolationRational(soplex,&boundviol,&sumviol);
      if (bVar3) {
        bVar3 = ::soplex::
                SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ::getRowViolationRational(soplex,&rowviol,&sumviol);
        if (!bVar3) goto LAB_003a53dc;
        VVar13 = (soplex->spxout).m_verbosity;
        if (2 < (int)VVar13) {
          (soplex->spxout).m_verbosity = INFO1;
          bVar3 = boost::multiprecision::default_ops::
                  eval_gt<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>>>
                            (&boundviol.m_backend,&rowviol.m_backend);
          pRVar12 = &rowviol;
          if (bVar3) {
            pRVar12 = &boundviol;
          }
          boost::multiprecision::backends::
          rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
          ::rational_adaptor(&maxviol.m_backend,&pRVar12->m_backend);
          local_b8[0]._0_8_ = soplex->_currentSettings->_realParamValues[0];
          tVar4 = boost::multiprecision::operator<=(&maxviol,(double *)local_b8[0].la);
          pSVar5 = ::soplex::operator<<(&soplex->spxout,"Primal solution ");
          pcVar9 = "infeasible";
          if (tVar4) {
            pcVar9 = "feasible";
          }
          pSVar5 = ::soplex::operator<<(pSVar5,pcVar9);
          pSVar5 = ::soplex::operator<<(pSVar5," in original problem (max. violation = ");
          boost::multiprecision::backends::
          rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
          ::rational_adaptor((rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                              *)&local_b8[0].ld,&maxviol.m_backend);
          pSVar5 = ::soplex::operator<<
                             (pSVar5,(number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
                                      *)&local_b8[0].ld);
          ::soplex::operator<<(pSVar5,").\n");
          boost::
          rational<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>,_(boost::multiprecision::expression_template_option)1>_>
          ::~rational((rational<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>,_(boost::multiprecision::expression_template_option)1>_>
                       *)&local_b8[0].ld);
          (soplex->spxout).m_verbosity = VVar13;
          boost::
          rational<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>,_(boost::multiprecision::expression_template_option)1>_>
          ::~rational((rational<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>,_(boost::multiprecision::expression_template_option)1>_>
                       *)&maxviol);
        }
      }
      else {
LAB_003a53dc:
        VVar13 = (soplex->spxout).m_verbosity;
        if (2 < (int)VVar13) {
          (soplex->spxout).m_verbosity = INFO1;
          ::soplex::operator<<(&soplex->spxout,"Could not check primal solution.\n");
          (soplex->spxout).m_verbosity = VVar13;
        }
      }
      boost::
      rational<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>,_(boost::multiprecision::expression_template_option)1>_>
      ::~rational((rational<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>,_(boost::multiprecision::expression_template_option)1>_>
                   *)&sumviol);
      boost::
      rational<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>,_(boost::multiprecision::expression_template_option)1>_>
      ::~rational((rational<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>,_(boost::multiprecision::expression_template_option)1>_>
                   *)&rowviol);
      boost::
      rational<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>,_(boost::multiprecision::expression_template_option)1>_>
      ::~rational((rational<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>,_(boost::multiprecision::expression_template_option)1>_>
                   *)&boundviol);
    }
    if ((soplex->_hasSolReal != false) || ((soplex->_hasSolRational & 1U) != 0)) {
      boundviol.m_backend.m_value.num.m_backend.
      super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
      .m_data.la[0] = 0;
      boundviol.m_backend.m_value.num.m_backend.
      super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
      .m_limbs = 1;
      boundviol.m_backend.m_value.num.m_backend.
      super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
      .m_sign = false;
      boundviol.m_backend.m_value.num.m_backend.
      super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
      .m_internal = true;
      boundviol.m_backend.m_value.num.m_backend.
      super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
      .m_alias = false;
      boundviol.m_backend.m_value.den.m_backend.
      super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
      .m_data.la[0] = 1;
      rowviol.m_backend.m_value.num.m_backend.
      super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
      .m_data.la[0] = 0;
      boundviol.m_backend.m_value.den.m_backend.
      super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
      .m_limbs = 1;
      boundviol.m_backend.m_value.den.m_backend.
      super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
      .m_sign = false;
      boundviol.m_backend.m_value.den.m_backend.
      super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
      .m_internal = true;
      boundviol.m_backend.m_value.den.m_backend.
      super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
      .m_alias = false;
      rowviol.m_backend.m_value.num.m_backend.
      super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
      .m_limbs = 1;
      rowviol.m_backend.m_value.num.m_backend.
      super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
      .m_sign = false;
      rowviol.m_backend.m_value.num.m_backend.
      super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
      .m_internal = true;
      rowviol.m_backend.m_value.num.m_backend.
      super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
      .m_alias = false;
      rowviol.m_backend.m_value.den.m_backend.
      super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
      .m_data.la[0] = 1;
      sumviol.m_backend.m_value.num.m_backend.
      super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
      .m_data.la[0] = 0;
      rowviol.m_backend.m_value.den.m_backend.
      super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
      .m_limbs = 1;
      rowviol.m_backend.m_value.den.m_backend.
      super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
      .m_sign = false;
      rowviol.m_backend.m_value.den.m_backend.
      super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
      .m_internal = true;
      rowviol.m_backend.m_value.den.m_backend.
      super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
      .m_alias = false;
      sumviol.m_backend.m_value.num.m_backend.
      super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
      .m_limbs = 1;
      sumviol.m_backend.m_value.num.m_backend.
      super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
      .m_sign = false;
      sumviol.m_backend.m_value.num.m_backend.
      super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
      .m_internal = true;
      sumviol.m_backend.m_value.num.m_backend.
      super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
      .m_alias = false;
      sumviol.m_backend.m_value.den.m_backend.
      super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
      .m_data.la[0] = 1;
      sumviol.m_backend.m_value.den.m_backend.
      super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
      .m_limbs = 1;
      sumviol.m_backend.m_value.den.m_backend.
      super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
      .m_sign = false;
      sumviol.m_backend.m_value.den.m_backend.
      super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
      .m_internal = true;
      sumviol.m_backend.m_value.den.m_backend.
      super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
      .m_alias = false;
      bVar3 = ::soplex::
              SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ::getRedCostViolationRational(soplex,&boundviol,&sumviol);
      if (bVar3) {
        bVar3 = ::soplex::
                SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ::getDualViolationRational(soplex,&rowviol,&sumviol);
        if (!bVar3) goto LAB_003a5605;
        VVar13 = (soplex->spxout).m_verbosity;
        if (2 < (int)VVar13) {
          (soplex->spxout).m_verbosity = INFO1;
          bVar3 = boost::multiprecision::default_ops::
                  eval_gt<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>>>
                            (&boundviol.m_backend,&rowviol.m_backend);
          pRVar12 = &rowviol;
          if (bVar3) {
            pRVar12 = &boundviol;
          }
          boost::multiprecision::backends::
          rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
          ::rational_adaptor(&maxviol.m_backend,&pRVar12->m_backend);
          local_138[0]._0_8_ = soplex->_currentSettings->_realParamValues[1];
          tVar4 = boost::multiprecision::operator<=(&maxviol,(double *)local_138[0].la);
          pSVar5 = ::soplex::operator<<(&soplex->spxout,"Dual solution ");
          pcVar9 = "infeasible";
          if (tVar4) {
            pcVar9 = "feasible";
          }
          pSVar5 = ::soplex::operator<<(pSVar5,pcVar9);
          pSVar5 = ::soplex::operator<<(pSVar5," in original problem (max. violation = ");
          boost::multiprecision::backends::
          rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
          ::rational_adaptor((rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                              *)&local_138[0].ld,&maxviol.m_backend);
          pSVar5 = ::soplex::operator<<
                             (pSVar5,(number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
                                      *)&local_138[0].ld);
          ::soplex::operator<<(pSVar5,").\n");
          boost::
          rational<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>,_(boost::multiprecision::expression_template_option)1>_>
          ::~rational((rational<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>,_(boost::multiprecision::expression_template_option)1>_>
                       *)&local_138[0].ld);
          (soplex->spxout).m_verbosity = VVar13;
          boost::
          rational<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>,_(boost::multiprecision::expression_template_option)1>_>
          ::~rational((rational<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>,_(boost::multiprecision::expression_template_option)1>_>
                       *)&maxviol);
        }
      }
      else {
LAB_003a5605:
        VVar13 = (soplex->spxout).m_verbosity;
        if (2 < (int)VVar13) {
          (soplex->spxout).m_verbosity = INFO1;
          ::soplex::operator<<(&soplex->spxout,"Could not check dual solution.\n");
          (soplex->spxout).m_verbosity = VVar13;
        }
      }
      boost::
      rational<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>,_(boost::multiprecision::expression_template_option)1>_>
      ::~rational((rational<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>,_(boost::multiprecision::expression_template_option)1>_>
                   *)&sumviol);
      boost::
      rational<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>,_(boost::multiprecision::expression_template_option)1>_>
      ::~rational((rational<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>,_(boost::multiprecision::expression_template_option)1>_>
                   *)&rowviol);
      boost::
      rational<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>,_(boost::multiprecision::expression_template_option)1>_>
      ::~rational((rational<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>,_(boost::multiprecision::expression_template_option)1>_>
                   *)&boundviol);
      VVar13 = (soplex->spxout).m_verbosity;
      goto LAB_003a564f;
    }
    VVar13 = (soplex->spxout).m_verbosity;
LAB_003a5438:
    if ((int)VVar13 < 3) goto LAB_003a564f;
    pSVar5 = &soplex->spxout;
    (soplex->spxout).m_verbosity = INFO1;
    pcVar9 = "No dual solution available.\n";
  }
  else {
    if ((soplex->_hasSolReal == false) && ((soplex->_hasSolRational & 1U) == 0)) {
      VVar13 = (soplex->spxout).m_verbosity;
      if (2 < (int)VVar13) {
        pSVar5 = &soplex->spxout;
        (soplex->spxout).m_verbosity = INFO1;
        pcVar9 = "No primal solution available.\n";
LAB_003a515d:
        ::soplex::operator<<(pSVar5,pcVar9);
        (soplex->spxout).m_verbosity = VVar13;
      }
    }
    else {
      boundviol.m_backend.m_value.num.m_backend.
      super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
      .m_data.la[0] = 0;
      boundviol.m_backend.m_value.num.m_backend.
      super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
      .m_data.ld.data = (limb_pointer)0x0;
      boundviol.m_backend.m_value.num.m_backend.
      super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
      .m_limbs = 0;
      boundviol.m_backend.m_value.num.m_backend.
      super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
      .m_sign = false;
      boundviol.m_backend.m_value.num.m_backend.
      super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
      .m_internal = false;
      boundviol.m_backend.m_value.num.m_backend.
      super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
      .m_alias = false;
      boundviol.m_backend.m_value.num.m_backend.
      super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
      ._23_1_ = 0;
      boundviol.m_backend.m_value.num.m_backend.
      super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
      ._24_8_ = 0;
      boundviol.m_backend.m_value.den.m_backend.
      super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
      .m_data.la[0] = 0;
      boundviol.m_backend.m_value.den.m_backend.
      super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
      .m_data.ld.data = (limb_pointer)0x0;
      boundviol.m_backend.m_value.den.m_backend.
      super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
      .m_limbs = 0;
      boundviol.m_backend.m_value.den.m_backend.
      super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
      .m_sign = false;
      boundviol.m_backend.m_value.den.m_backend.
      super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
      .m_internal = false;
      boundviol.m_backend.m_value.den.m_backend.
      super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
      .m_alias = false;
      boundviol.m_backend.m_value.den.m_backend.
      super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
      ._23_1_ = 0;
      boundviol.m_backend.m_value.den.m_backend.
      super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
      ._24_8_ = 0;
      rowviol.m_backend.m_value.num.m_backend.
      super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
      .m_data.la[0] = 0;
      rowviol.m_backend.m_value.num.m_backend.
      super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
      .m_data.ld.data = (limb_pointer)0x0;
      rowviol.m_backend.m_value.num.m_backend.
      super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
      .m_limbs = 0;
      rowviol.m_backend.m_value.num.m_backend.
      super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
      .m_sign = false;
      rowviol.m_backend.m_value.num.m_backend.
      super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
      .m_internal = false;
      rowviol.m_backend.m_value.num.m_backend.
      super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
      .m_alias = false;
      rowviol.m_backend.m_value.num.m_backend.
      super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
      ._23_1_ = 0;
      rowviol.m_backend.m_value.num.m_backend.
      super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
      ._24_8_ = 0;
      rowviol.m_backend.m_value.den.m_backend.
      super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
      .m_data.la[0] = 0;
      rowviol.m_backend.m_value.den.m_backend.
      super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
      .m_data.ld.data = (limb_pointer)0x0;
      rowviol.m_backend.m_value.den.m_backend.
      super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
      .m_limbs = 0;
      rowviol.m_backend.m_value.den.m_backend.
      super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
      .m_sign = false;
      rowviol.m_backend.m_value.den.m_backend.
      super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
      .m_internal = false;
      rowviol.m_backend.m_value.den.m_backend.
      super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
      .m_alias = false;
      rowviol.m_backend.m_value.den.m_backend.
      super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
      ._23_1_ = 0;
      rowviol.m_backend.m_value.den.m_backend.
      super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
      ._24_8_ = 0;
      sumviol.m_backend.m_value.num.m_backend.
      super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
      .m_data.la[0] = 0;
      sumviol.m_backend.m_value.num.m_backend.
      super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
      .m_data.ld.data = (limb_pointer)0x0;
      sumviol.m_backend.m_value.num.m_backend.
      super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
      .m_limbs = 0;
      sumviol.m_backend.m_value.num.m_backend.
      super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
      .m_sign = false;
      sumviol.m_backend.m_value.num.m_backend.
      super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
      .m_internal = false;
      sumviol.m_backend.m_value.num.m_backend.
      super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
      .m_alias = false;
      sumviol.m_backend.m_value.num.m_backend.
      super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
      ._23_1_ = 0;
      sumviol.m_backend.m_value.num.m_backend.
      super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
      ._24_8_ = 0;
      sumviol.m_backend.m_value.den.m_backend.
      super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
      .m_data.la[0] = 0;
      sumviol.m_backend.m_value.den.m_backend.
      super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
      .m_data.ld.data = (limb_pointer)0x0;
      sumviol.m_backend.m_value.den.m_backend.
      super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
      .m_limbs = 0;
      sumviol.m_backend.m_value.den.m_backend.
      super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
      .m_sign = false;
      sumviol.m_backend.m_value.den.m_backend.
      super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
      .m_internal = false;
      sumviol.m_backend.m_value.den.m_backend.
      super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
      .m_alias = false;
      sumviol.m_backend.m_value.den.m_backend.
      super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
      ._23_1_ = 0;
      sumviol.m_backend.m_value.den.m_backend.
      super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
      ._24_8_ = 0;
      bVar3 = ::soplex::
              SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ::getBoundViolation(soplex,(number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                          *)&boundviol,
                                  (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                   *)&sumviol);
      if (bVar3) {
        bVar3 = ::soplex::
                SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ::getRowViolation(soplex,(number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                          *)&rowviol,
                                  (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                   *)&sumviol);
        if (bVar3) {
          VVar13 = (soplex->spxout).m_verbosity;
          if (2 < (int)VVar13) {
            (soplex->spxout).m_verbosity = INFO1;
            tVar4 = boost::multiprecision::operator>
                              ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                *)&boundviol,
                               (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                *)&rowviol);
            pnVar8 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                      *)&rowviol;
            if (tVar4) {
              pnVar8 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                        *)&boundviol;
            }
            pnVar7 = pnVar8;
            pnVar10 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                       *)&maxviol;
            for (lVar6 = 0x1c; lVar6 != 0; lVar6 = lVar6 + -1) {
              (pnVar10->m_backend).data._M_elems[0] = (pnVar7->m_backend).data._M_elems[0];
              pnVar7 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                        *)((long)pnVar7 + ((ulong)bVar14 * -2 + 1) * 4);
              pnVar10 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                         *)((long)pnVar10 + ((ulong)bVar14 * -2 + 1) * 4);
            }
            iVar1 = (pnVar8->m_backend).exp;
            bVar3 = (pnVar8->m_backend).neg;
            uVar15 = (int)((uint)tVar4 << 0x1f) >> 0x1f;
            local_b8[0]._0_8_ = soplex->_currentSettings->_realParamValues[0];
            tVar4 = boost::multiprecision::operator<=
                              ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                *)&maxviol,(double *)local_b8[0].la);
            pSVar5 = ::soplex::operator<<(&soplex->spxout,"Primal solution ");
            pcVar9 = "infeasible";
            if (tVar4) {
              pcVar9 = "feasible";
            }
            pSVar5 = ::soplex::operator<<(pSVar5,pcVar9);
            pSVar5 = ::soplex::operator<<(pSVar5," in original problem (max. violation = ");
            poVar2 = pSVar5->m_streams[pSVar5->m_verbosity];
            *(uint *)(poVar2 + *(long *)(*(long *)poVar2 + -0x18) + 0x18) =
                 *(uint *)(poVar2 + *(long *)(*(long *)poVar2 + -0x18) + 0x18) & 0xfffffefb | 0x100;
            pnVar8 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                      *)&maxviol;
            pdVar11 = local_b8;
            for (lVar6 = 0x1c; lVar6 != 0; lVar6 = lVar6 + -1) {
              (((cpp_dec_float<200U,_int,_void> *)&(pdVar11->ld).capacity)->data)._M_elems[0] =
                   (pnVar8->m_backend).data._M_elems[0];
              pnVar8 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                        *)((long)pnVar8 + ((ulong)bVar14 * -2 + 1) * 4);
              pdVar11 = (data_type *)((long)pdVar11 + ((ulong)bVar14 * -2 + 1) * 4);
            }
            local_48 = iVar1;
            local_44 = bVar3;
            local_40 = ~((ulong)uVar15 << 0x20) & 0x1c00000000 | ((ulong)uVar15 & 0x1c) << 0x20;
            pSVar5 = ::soplex::operator<<
                               (pSVar5,(number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                        *)&local_b8[0].ld);
            poVar2 = pSVar5->m_streams[pSVar5->m_verbosity];
            lVar6 = *(long *)poVar2;
            *(undefined8 *)(poVar2 + *(long *)(lVar6 + -0x18) + 8) = 8;
            lVar6 = *(long *)(lVar6 + -0x18);
            *(uint *)(poVar2 + lVar6 + 0x18) = *(uint *)(poVar2 + lVar6 + 0x18) & 0xfffffefb | 4;
            pcVar9 = ").\n";
            goto LAB_003a515d;
          }
          goto LAB_003a5166;
        }
      }
      VVar13 = (soplex->spxout).m_verbosity;
      if (2 < (int)VVar13) {
        pSVar5 = &soplex->spxout;
        (soplex->spxout).m_verbosity = INFO1;
        pcVar9 = "Could not check primal solution.\n";
        goto LAB_003a515d;
      }
    }
LAB_003a5166:
    if ((soplex->_hasSolReal == false) && ((soplex->_hasSolRational & 1U) == 0)) goto LAB_003a5438;
    boundviol.m_backend.m_value.num.m_backend.
    super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
    .m_data.la[0] = 0;
    boundviol.m_backend.m_value.num.m_backend.
    super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
    .m_data.ld.data = (limb_pointer)0x0;
    boundviol.m_backend.m_value.num.m_backend.
    super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
    .m_limbs = 0;
    boundviol.m_backend.m_value.num.m_backend.
    super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
    .m_sign = false;
    boundviol.m_backend.m_value.num.m_backend.
    super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
    .m_internal = false;
    boundviol.m_backend.m_value.num.m_backend.
    super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
    .m_alias = false;
    boundviol.m_backend.m_value.num.m_backend.
    super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
    ._23_1_ = 0;
    boundviol.m_backend.m_value.num.m_backend.
    super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
    ._24_8_ = 0;
    boundviol.m_backend.m_value.den.m_backend.
    super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
    .m_data.la[0] = 0;
    boundviol.m_backend.m_value.den.m_backend.
    super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
    .m_data.ld.data = (limb_pointer)0x0;
    boundviol.m_backend.m_value.den.m_backend.
    super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
    .m_limbs = 0;
    boundviol.m_backend.m_value.den.m_backend.
    super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
    .m_sign = false;
    boundviol.m_backend.m_value.den.m_backend.
    super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
    .m_internal = false;
    boundviol.m_backend.m_value.den.m_backend.
    super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
    .m_alias = false;
    boundviol.m_backend.m_value.den.m_backend.
    super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
    ._23_1_ = 0;
    boundviol.m_backend.m_value.den.m_backend.
    super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
    ._24_8_ = 0;
    rowviol.m_backend.m_value.num.m_backend.
    super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
    .m_data.la[0] = 0;
    rowviol.m_backend.m_value.num.m_backend.
    super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
    .m_data.ld.data = (limb_pointer)0x0;
    rowviol.m_backend.m_value.num.m_backend.
    super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
    .m_limbs = 0;
    rowviol.m_backend.m_value.num.m_backend.
    super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
    .m_sign = false;
    rowviol.m_backend.m_value.num.m_backend.
    super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
    .m_internal = false;
    rowviol.m_backend.m_value.num.m_backend.
    super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
    .m_alias = false;
    rowviol.m_backend.m_value.num.m_backend.
    super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
    ._23_1_ = 0;
    rowviol.m_backend.m_value.num.m_backend.
    super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
    ._24_8_ = 0;
    rowviol.m_backend.m_value.den.m_backend.
    super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
    .m_data.la[0] = 0;
    rowviol.m_backend.m_value.den.m_backend.
    super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
    .m_data.ld.data = (limb_pointer)0x0;
    rowviol.m_backend.m_value.den.m_backend.
    super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
    .m_limbs = 0;
    rowviol.m_backend.m_value.den.m_backend.
    super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
    .m_sign = false;
    rowviol.m_backend.m_value.den.m_backend.
    super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
    .m_internal = false;
    rowviol.m_backend.m_value.den.m_backend.
    super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
    .m_alias = false;
    rowviol.m_backend.m_value.den.m_backend.
    super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
    ._23_1_ = 0;
    rowviol.m_backend.m_value.den.m_backend.
    super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
    ._24_8_ = 0;
    sumviol.m_backend.m_value.num.m_backend.
    super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
    .m_data.la[0] = 0;
    sumviol.m_backend.m_value.num.m_backend.
    super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
    .m_data.ld.data = (limb_pointer)0x0;
    sumviol.m_backend.m_value.num.m_backend.
    super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
    .m_limbs = 0;
    sumviol.m_backend.m_value.num.m_backend.
    super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
    .m_sign = false;
    sumviol.m_backend.m_value.num.m_backend.
    super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
    .m_internal = false;
    sumviol.m_backend.m_value.num.m_backend.
    super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
    .m_alias = false;
    sumviol.m_backend.m_value.num.m_backend.
    super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
    ._23_1_ = 0;
    sumviol.m_backend.m_value.num.m_backend.
    super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
    ._24_8_ = 0;
    sumviol.m_backend.m_value.den.m_backend.
    super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
    .m_data.la[0] = 0;
    sumviol.m_backend.m_value.den.m_backend.
    super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
    .m_data.ld.data = (limb_pointer)0x0;
    sumviol.m_backend.m_value.den.m_backend.
    super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
    .m_limbs = 0;
    sumviol.m_backend.m_value.den.m_backend.
    super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
    .m_sign = false;
    sumviol.m_backend.m_value.den.m_backend.
    super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
    .m_internal = false;
    sumviol.m_backend.m_value.den.m_backend.
    super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
    .m_alias = false;
    sumviol.m_backend.m_value.den.m_backend.
    super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
    ._23_1_ = 0;
    sumviol.m_backend.m_value.den.m_backend.
    super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
    ._24_8_ = 0;
    bVar3 = ::soplex::
            SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ::getRedCostViolation
                      (soplex,(number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                               *)&boundviol,
                       (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                        *)&sumviol);
    if (bVar3) {
      bVar3 = ::soplex::
              SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ::getDualViolation(soplex,(number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                         *)&rowviol,
                                 (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                  *)&sumviol);
      if (!bVar3) goto LAB_003a53ba;
      VVar13 = (soplex->spxout).m_verbosity;
      if ((int)VVar13 < 3) goto LAB_003a564f;
      (soplex->spxout).m_verbosity = INFO1;
      tVar4 = boost::multiprecision::operator>
                        ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)&boundviol,
                         (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)&rowviol);
      pnVar8 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                *)&rowviol;
      if (tVar4) {
        pnVar8 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                  *)&boundviol;
      }
      pnVar7 = pnVar8;
      pnVar10 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)&maxviol;
      for (lVar6 = 0x1c; lVar6 != 0; lVar6 = lVar6 + -1) {
        (pnVar10->m_backend).data._M_elems[0] = (pnVar7->m_backend).data._M_elems[0];
        pnVar7 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                  *)((long)pnVar7 + ((ulong)bVar14 * -2 + 1) * 4);
        pnVar10 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                   *)((long)pnVar10 + ((ulong)bVar14 * -2 + 1) * 4);
      }
      iVar1 = (pnVar8->m_backend).exp;
      bVar3 = (pnVar8->m_backend).neg;
      uVar15 = (int)((uint)tVar4 << 0x1f) >> 0x1f;
      local_138[0]._0_8_ = soplex->_currentSettings->_realParamValues[1];
      tVar4 = boost::multiprecision::operator<=
                        ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)&maxviol,(double *)local_138[0].la);
      pSVar5 = ::soplex::operator<<(&soplex->spxout,"Dual solution ");
      pcVar9 = "infeasible";
      if (tVar4) {
        pcVar9 = "feasible";
      }
      pSVar5 = ::soplex::operator<<(pSVar5,pcVar9);
      pSVar5 = ::soplex::operator<<(pSVar5," in original problem (max. violation = ");
      poVar2 = pSVar5->m_streams[pSVar5->m_verbosity];
      *(uint *)(poVar2 + *(long *)(*(long *)poVar2 + -0x18) + 0x18) =
           *(uint *)(poVar2 + *(long *)(*(long *)poVar2 + -0x18) + 0x18) & 0xfffffefb | 0x100;
      pnVar8 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                *)&maxviol;
      pdVar11 = local_138;
      for (lVar6 = 0x1c; lVar6 != 0; lVar6 = lVar6 + -1) {
        (((cpp_dec_float<200U,_int,_void> *)&(pdVar11->ld).capacity)->data)._M_elems[0] =
             (pnVar8->m_backend).data._M_elems[0];
        pnVar8 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                  *)((long)pnVar8 + ((ulong)bVar14 * -2 + 1) * 4);
        pdVar11 = (data_type *)((long)pdVar11 + ((ulong)bVar14 * -2 + 1) * 4);
      }
      local_c8 = iVar1;
      local_c4 = bVar3;
      local_c0 = ~((ulong)uVar15 << 0x20) & 0x1c00000000 | ((ulong)uVar15 & 0x1c) << 0x20;
      pSVar5 = ::soplex::operator<<
                         (pSVar5,(number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                  *)&local_138[0].ld);
      poVar2 = pSVar5->m_streams[pSVar5->m_verbosity];
      lVar6 = *(long *)poVar2;
      *(undefined8 *)(poVar2 + *(long *)(lVar6 + -0x18) + 8) = 8;
      lVar6 = *(long *)(lVar6 + -0x18);
      *(uint *)(poVar2 + lVar6 + 0x18) = *(uint *)(poVar2 + lVar6 + 0x18) & 0xfffffefb | 4;
      pcVar9 = ").\n";
    }
    else {
LAB_003a53ba:
      VVar13 = (soplex->spxout).m_verbosity;
      if ((int)VVar13 < 3) goto LAB_003a564f;
      pSVar5 = &soplex->spxout;
      (soplex->spxout).m_verbosity = INFO1;
      pcVar9 = "Could not check dual solution.\n";
    }
  }
  ::soplex::operator<<(pSVar5,pcVar9);
  (soplex->spxout).m_verbosity = VVar13;
LAB_003a564f:
  if (2 < (int)VVar13) {
    (soplex->spxout).m_verbosity = INFO1;
    ::soplex::operator<<(&soplex->spxout,"\n");
    (soplex->spxout).m_verbosity = VVar13;
  }
  return;
}

Assistant:

void checkSolution(SoPlexBase<R>& soplex)
{
   if(soplex.intParam(SoPlexBase<R>::CHECKMODE) == SoPlexBase<R>::CHECKMODE_RATIONAL
         || (soplex.intParam(SoPlexBase<R>::CHECKMODE) == SoPlexBase<R>::CHECKMODE_AUTO
             && soplex.intParam(SoPlexBase<R>::READMODE) == SoPlexBase<R>::READMODE_RATIONAL))
   {
      checkSolutionRational(soplex);
   }
   else
   {
      checkSolutionReal(soplex);
   }

   SPX_MSG_INFO1(soplex.spxout, soplex.spxout << "\n");
}